

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TimingPathSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TimingPathSymbol,slang::SourceLocation,slang::ast::TimingPathSymbol::ConnectionKind&,slang::ast::TimingPathSymbol::Polarity&,slang::ast::TimingPathSymbol::Polarity&,slang::ast::EdgeKind&>
          (BumpAllocator *this,SourceLocation *args,ConnectionKind *args_1,Polarity *args_2,
          Polarity *args_3,EdgeKind *args_4)

{
  TimingPathSymbol *this_00;
  
  this_00 = (TimingPathSymbol *)allocate(this,0x98,8);
  ast::TimingPathSymbol::TimingPathSymbol(this_00,*args,*args_1,*args_2,*args_3,*args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }